

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderDockWindow(char *window_name,ImGuiID node_id)

{
  ImVec2ih *pIVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  ImU32 key;
  ImGuiWindow *window;
  ImGuiWindowSettings *pIVar4;
  ImGuiWindowSettings *pIVar5;
  ImGuiContext *g;
  
  key = ImHashStr(window_name,0,0);
  pIVar3 = GImGui;
  window = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
  if (window == (ImGuiWindow *)0x0) {
    pIVar5 = (ImGuiWindowSettings *)(pIVar3->SettingsWindows).Buf.Data;
    pIVar1 = &pIVar5->Pos;
    if (pIVar5 != (ImGuiWindowSettings *)0x0) {
      pIVar4 = (ImGuiWindowSettings *)pIVar1;
      do {
        pIVar5 = pIVar4;
        if (pIVar5->ID == key) break;
        iVar2._0_2_ = pIVar5[-1].DockOrder;
        iVar2._2_1_ = pIVar5[-1].Collapsed;
        iVar2._3_1_ = pIVar5[-1].field_0x1f;
        pIVar4 = (ImGuiWindowSettings *)((long)&pIVar5->ID + (long)iVar2);
        pIVar5 = (ImGuiWindowSettings *)0x0;
      } while (pIVar4 != (ImGuiWindowSettings *)
                         ((long)&pIVar1->x + (long)(pIVar3->SettingsWindows).Buf.Size));
    }
    if (pIVar5 == (ImGuiWindowSettings *)0x0) {
      pIVar5 = CreateNewWindowSettings(window_name);
    }
    pIVar5->DockId = node_id;
    pIVar5->DockOrder = -1;
  }
  else {
    SetWindowDock(window,node_id,1);
    window->DockOrder = -1;
  }
  return;
}

Assistant:

void ImGui::DockBuilderDockWindow(const char* window_name, ImGuiID node_id)
{
    // We don't preserve relative order of multiple docked windows (by clearing DockOrder back to -1)
    ImGuiID window_id = ImHashStr(window_name);
    if (ImGuiWindow* window = FindWindowByID(window_id))
    {
        // Apply to created window
        SetWindowDock(window, node_id, ImGuiCond_Always);
        window->DockOrder = -1;
    }
    else
    {
        // Apply to settings
        ImGuiWindowSettings* settings = FindWindowSettings(window_id);
        if (settings == NULL)
            settings = CreateNewWindowSettings(window_name);
        settings->DockId = node_id;
        settings->DockOrder = -1;
    }
}